

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNode.cpp
# Opt level: O0

void dg::addOperandsParams
               (LLVMDGParameters *params,LLVMDGParameters *formal,LLVMNode *callNode,Function *func,
               bool fork)

{
  arg_iterator pAVar1;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *__args_1;
  DGParameterPair<dg::LLVMNode> *k;
  DGParameterPair<dg::LLVMNode> *args;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RDX;
  LLVMNode *in_RDI;
  LLVMDGParameter *ap;
  LLVMDGParameter *fp;
  Value *opval;
  arg_iterator E;
  arg_iterator A;
  int idx;
  LLVMNode *out;
  LLVMNode *in;
  CallInst *CInst;
  LLVMNode *in_stack_ffffffffffffff58;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_stack_ffffffffffffff60;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_stack_ffffffffffffff68;
  raw_ostream *in_stack_ffffffffffffff70;
  pair<dg::LLVMNode_*,_dg::LLVMNode_*> in_stack_ffffffffffffff80;
  LLVMNode *args_1;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this;
  arg_iterator local_50;
  
  LLVMNode::getValue((LLVMNode *)0x178400);
  llvm::dyn_cast<llvm::CallInst,llvm::Value>((Value *)in_stack_ffffffffffffff60);
  local_50 = llvm::Function::arg_begin((Function *)in_stack_ffffffffffffff60);
  pAVar1 = llvm::Function::arg_end((Function *)in_stack_ffffffffffffff60);
  for (; local_50 != pAVar1; local_50 = local_50 + 0x28) {
    __args_1 = (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *)
               llvm::CallBase::getArgOperand
                         ((CallBase *)in_stack_ffffffffffffff60,
                          (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    k = DGParameters<dg::LLVMNode>::find
                  ((DGParameters<dg::LLVMNode> *)in_stack_ffffffffffffff68,
                   (KeyT)in_stack_ffffffffffffff60);
    if (k == (DGParameterPair<dg::LLVMNode> *)0x0) {
      llvm::errs();
      llvm::raw_ostream::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
      llvm::operator<<((raw_ostream *)in_stack_ffffffffffffff60,(Value *)in_stack_ffffffffffffff58);
      llvm::raw_ostream::operator<<(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
    }
    else {
      args = DGParameters<dg::LLVMNode>::find
                       ((DGParameters<dg::LLVMNode> *)in_stack_ffffffffffffff68,
                        (KeyT)in_stack_ffffffffffffff60);
      args_1 = in_stack_ffffffffffffff80.second;
      if (args == (DGParameterPair<dg::LLVMNode> *)0x0) {
        in_stack_ffffffffffffff58 = in_RDI;
        in_stack_ffffffffffffff68 = __args_1;
        this = __args_1;
        Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::getDG(in_RDX);
        in_stack_ffffffffffffff80 =
             DGParameters<dg::LLVMNode>::construct<llvm::Value*,dg::LLVMDependenceGraph*>
                       ((DGParameters<dg::LLVMNode> *)this,(KeyT)k,(Value *)args,
                        (LLVMDependenceGraph *)args_1);
        std::tie<dg::LLVMNode*,dg::LLVMNode*>
                  ((LLVMNode **)in_stack_ffffffffffffff68,(LLVMNode **)__args_1);
        std::tuple<dg::LLVMNode*&,dg::LLVMNode*&>::operator=
                  ((tuple<dg::LLVMNode_*&,_dg::LLVMNode_*&> *)in_stack_ffffffffffffff70,
                   (pair<dg::LLVMNode_*,_dg::LLVMNode_*> *)in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff60 = __args_1;
      }
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addControlDependence
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addDataDependence
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::addDataDependence
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  return;
}

Assistant:

static void addOperandsParams(LLVMDGParameters *params,
                              LLVMDGParameters *formal, LLVMNode *callNode,
                              llvm::Function *func, bool fork = false) {
    llvm::CallInst *CInst =
            llvm::dyn_cast<llvm::CallInst>(callNode->getValue());
    assert(CInst && "addActualParameters called on non-CallInst");

    LLVMNode *in, *out;
    int idx;
    if (fork) {
        idx = 3;
    } else {
        idx = 0;
    }
    for (auto A = func->arg_begin(), E = func->arg_end(); A != E; ++A, ++idx) {
        llvm::Value *opval = CInst->getArgOperand(idx);
        LLVMDGParameter *fp = formal->find(&*A);
        if (!fp) {
            errs() << "ERR: no formal param for value: " << *opval << "\n";
            continue;
        }

        LLVMDGParameter *ap = params->find(opval);
        if (!ap) {
            std::tie(in, out) =
                    params->construct(opval, opval, callNode->getDG());
        } else {
            in = ap->in;
            out = ap->out;
        }
        assert(in && out);

        // add control edges from the call-site node
        // to the parameters
        callNode->addControlDependence(in);
        callNode->addControlDependence(out);

        // from actual in to formal in
        in->addDataDependence(fp->in);
        // from formal out to actual out
        fp->out->addDataDependence(out);
    }
}